

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::ReadShader(MD3Importer *this,ShaderData *fill)

{
  string *__lhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string model_file;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::find_last_of((char *)&this->path,0x7210be,(this->path)._M_string_length - 2)
  ;
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->path);
  if ((this->configShaderFile)._M_string_length == 0) {
    pcVar3 = (this->path)._M_dataplus._M_p;
    local_70[0] = &local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)local_50._M_dataplus._M_p);
    paVar1 = &local_90.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    paVar2 = &local_b0.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    bVar4 = Q3Shader::LoadShader(fill,&local_b0,this->mIOHandler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70[0] != &local_60) {
      operator_delete(local_70[0]);
    }
    if (bVar4) goto LAB_00451db4;
    pcVar3 = (this->path)._M_dataplus._M_p;
    local_70[0] = &local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)local_70,(ulong)(this->filename)._M_dataplus._M_p);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = puVar7[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_90._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    Q3Shader::LoadShader(fill,&local_b0,this->mIOHandler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Var9._M_p = (pointer)local_70[0];
    if (local_70[0] == &local_60) goto LAB_00451db4;
  }
  else {
    __lhs = &this->configShaderFile;
    lVar5 = std::__cxx11::string::rfind((char)__lhs,0x2e);
    if (lVar5 != -1) {
      Q3Shader::LoadShader(fill,__lhs,this->mIOHandler);
      goto LAB_00451db4;
    }
    std::operator+(&local_90,__lhs,&local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_b0.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    bVar4 = Q3Shader::LoadShader(fill,&local_b0,this->mIOHandler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (bVar4) goto LAB_00451db4;
    std::operator+(&local_90,__lhs,&this->filename);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    Q3Shader::LoadShader(fill,&local_b0,this->mIOHandler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    _Var9._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00451db4;
  }
  operator_delete(_Var9._M_p);
LAB_00451db4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MD3Importer::ReadShader(Q3Shader::ShaderData& fill) const
{
    // Determine Q3 model name from given path
    const std::string::size_type s = path.find_last_of("\\/",path.length()-2);
    const std::string model_file = path.substr(s+1,path.length()-(s+2));

    // If no specific dir or file is given, use our default search behaviour
    if (!configShaderFile.length()) {
        if(!Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + model_file + ".shader",mIOHandler)) {
            Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + filename + ".shader",mIOHandler);
        }
    }
    else {
        // If the given string specifies a file, load this file.
        // Otherwise it's a directory.
        const std::string::size_type st = configShaderFile.find_last_of('.');
        if (st == std::string::npos) {

            if(!Q3Shader::LoadShader(fill,configShaderFile + model_file + ".shader",mIOHandler)) {
                Q3Shader::LoadShader(fill,configShaderFile + filename + ".shader",mIOHandler);
            }
        }
        else {
            Q3Shader::LoadShader(fill,configShaderFile,mIOHandler);
        }
    }
}